

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

void __thiscall
glcts::LayoutBindingBaseCase::setTemplateParam
          (LayoutBindingBaseCase *this,eStageType stage,char *param,String *value)

{
  char *__s;
  char *pcVar1;
  mapped_type *this_00;
  mapped_type *pmVar2;
  allocator<char> local_45;
  eStageType local_44;
  key_type local_40;
  
  __s = (value->_M_dataplus)._M_p;
  local_44 = stage;
  this_00 = std::
            map<glcts::eStageType,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ::operator[](&this->m_templateParams,&local_44);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,param,&local_45);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_40);
  pcVar1 = (char *)pmVar2->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)pmVar2,0,pcVar1,(ulong)__s);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void setTemplateParam(eStageType stage, const char* param, const String& value)
	{
		m_templateParams[stage][param] = value.c_str();
	}